

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<unsigned_short>::Matcher(Matcher<unsigned_short> *this,unsigned_short value)

{
  unsigned_short local_2a;
  MatcherBase<unsigned_short> local_28;
  
  (this->super_MatcherBase<unsigned_short>).impl_.value_ =
       (MatcherInterface<const_unsigned_short_&> *)0x0;
  (this->super_MatcherBase<unsigned_short>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_short>).impl_.link_;
  (this->super_MatcherBase<unsigned_short>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00195d90;
  local_2a = value;
  internal::ComparisonBase::operator_cast_to_Matcher
            ((Matcher<unsigned_short> *)&local_28,(ComparisonBase *)&local_2a);
  internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::operator=
            (&(this->super_MatcherBase<unsigned_short>).impl_,&local_28.impl_);
  internal::MatcherBase<unsigned_short>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }